

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailure.cpp
# Opt level: O0

void __thiscall
MockFailure::addExpectationsAndCallHistory(MockFailure *this,MockExpectedCallsList *expectations)

{
  MockExpectedCallsList *pMVar1;
  SimpleString local_68;
  SimpleString local_58 [2];
  SimpleString local_38;
  SimpleString local_28;
  MockExpectedCallsList *local_18;
  MockExpectedCallsList *expectations_local;
  MockFailure *this_local;
  
  local_18 = expectations;
  expectations_local = (MockExpectedCallsList *)this;
  SimpleString::operator+=
            (&(this->super_TestFailure).message_,"\tEXPECTED calls that WERE NOT fulfilled:\n");
  pMVar1 = local_18;
  SimpleString::SimpleString(&local_38,"\t\t");
  (*pMVar1->_vptr_MockExpectedCallsList[0x1f])(&local_28,pMVar1,&local_38);
  SimpleString::operator+=(&(this->super_TestFailure).message_,&local_28);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_38);
  SimpleString::operator+=
            (&(this->super_TestFailure).message_,"\n\tEXPECTED calls that WERE fulfilled:\n");
  pMVar1 = local_18;
  SimpleString::SimpleString(&local_68,"\t\t");
  (*pMVar1->_vptr_MockExpectedCallsList[0x20])(local_58,pMVar1,&local_68);
  SimpleString::operator+=(&(this->super_TestFailure).message_,local_58);
  SimpleString::~SimpleString(local_58);
  SimpleString::~SimpleString(&local_68);
  return;
}

Assistant:

void MockFailure::addExpectationsAndCallHistory(const MockExpectedCallsList& expectations)
{
    message_ += "\tEXPECTED calls that WERE NOT fulfilled:\n";
    message_ += expectations.unfulfilledCallsToString("\t\t");
    message_ += "\n\tEXPECTED calls that WERE fulfilled:\n";
    message_ += expectations.fulfilledCallsToString("\t\t");
}